

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  ostream *poVar2;
  void *this;
  allocator<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_650;
  duration<long_double,_std::ratio<1L,_1L>_> local_628;
  allocator<char> local_609;
  string local_608;
  undefined1 local_5e8 [8];
  CppHttpLibClientConnector httpClient;
  CppHttpLibServerConnector httpServer;
  InMemoryConnector inMemoryConnector;
  MethodHandle local_290;
  allocator<char> local_269;
  string local_268;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_243;
  undefined1 local_242;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  iterator local_218;
  size_type local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  code *local_1f0;
  undefined8 local_1e8;
  MethodHandle local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_193;
  undefined1 local_192;
  allocator<char> local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  iterator local_168;
  size_type local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  code *local_140;
  undefined8 local_138;
  MethodHandle local_130;
  allocator<char> local_109;
  string local_108;
  undefined1 local_d8 [8];
  WarehouseServer app;
  JsonRpc2Server rpcServer;
  
  jsonrpccxx::JsonRpc2Server::JsonRpc2Server
            ((JsonRpc2Server *)&app.products._M_t._M_impl.super__Rb_tree_header._M_node_count);
  WarehouseServer::WarehouseServer((WarehouseServer *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"GetProduct",&local_109);
  local_140 = WarehouseServer::GetProduct;
  local_138 = 0;
  jsonrpccxx::GetHandle<WarehouseServer,Product_const&,std::__cxx11::string_const&>
            (&local_130,(jsonrpccxx *)WarehouseServer::GetProduct,0,(WarehouseServer *)local_d8);
  local_192 = 1;
  local_190 = &local_188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"id",&local_191);
  local_192 = 0;
  local_168 = &local_188;
  local_160 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_193);
  __l_00._M_len = local_160;
  __l_00._M_array = local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_158,__l_00,&local_193);
  jsonrpccxx::JsonRpcServer::Add
            ((JsonRpcServer *)&app.products._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_108,&local_130,&local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_193);
  local_650 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168;
  do {
    local_650 = local_650 + -1;
    std::__cxx11::string::~string((string *)local_650);
  } while (local_650 != &local_188);
  std::allocator<char>::~allocator(&local_191);
  std::
  function<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"AddProduct",&local_1b9);
  local_1f0 = WarehouseServer::AddProduct;
  local_1e8 = 0;
  jsonrpccxx::GetHandle<WarehouseServer,bool,Product_const&>
            (&local_1e0,(jsonrpccxx *)WarehouseServer::AddProduct,0,(WarehouseServer *)local_d8);
  local_242 = 1;
  local_240 = &local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"product",&local_241);
  local_242 = 0;
  local_218 = &local_238;
  local_210 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_243);
  __l._M_len = local_210;
  __l._M_array = local_218;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_208,__l,&local_243);
  jsonrpccxx::JsonRpcServer::Add
            ((JsonRpcServer *)&app.products._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_1b8,&local_1e0,&local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_243);
  local_688 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218;
  do {
    local_688 = local_688 + -1;
    std::__cxx11::string::~string((string *)local_688);
  } while (local_688 != &local_238);
  std::allocator<char>::~allocator(&local_241);
  std::
  function<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_1e0);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"AllProducts",&local_269);
  jsonrpccxx::GetHandle<WarehouseServer,std::vector<Product,std::allocator<Product>>>
            (&local_290,(jsonrpccxx *)WarehouseServer::AllProducts,0,(WarehouseServer *)local_d8);
  inMemoryConnector.server = (JsonRpcServer *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&inMemoryConnector.server);
  jsonrpccxx::JsonRpcServer::Add
            ((JsonRpcServer *)&app.products._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_268,&local_290,(NamedParamMapping *)&inMemoryConnector.server);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&inMemoryConnector.server);
  std::
  function<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_290);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  poVar2 = std::operator<<((ostream *)&std::cout,"Running in-memory example");
  std::operator<<(poVar2,"\n");
  InMemoryConnector::InMemoryConnector
            ((InMemoryConnector *)&httpServer.port,
             (JsonRpcServer *)&app.products._M_t._M_impl.super__Rb_tree_header._M_node_count);
  doWarehouseStuff((IClientConnector *)&httpServer.port);
  poVar2 = std::operator<<((ostream *)&std::cout,"Running http example");
  std::operator<<(poVar2,"\n");
  CppHttpLibServerConnector::CppHttpLibServerConnector
            ((CppHttpLibServerConnector *)&httpClient.httpClient,
             (JsonRpcServer *)&app.products._M_t._M_impl.super__Rb_tree_header._M_node_count,0x2124)
  ;
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting http server: ");
  this = (void *)std::ostream::operator<<(poVar2,std::boolalpha);
  bVar1 = CppHttpLibServerConnector::StartListening
                    ((CppHttpLibServerConnector *)&httpClient.httpClient);
  poVar2 = (ostream *)std::ostream::operator<<(this,bVar1);
  std::operator<<(poVar2,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"localhost",&local_609);
  CppHttpLibClientConnector::CppHttpLibClientConnector
            ((CppHttpLibClientConnector *)local_5e8,&local_608,0x2124);
  std::__cxx11::string::~string((string *)&local_608);
  this_00 = &local_609;
  std::allocator<char>::~allocator(this_00);
  s((duration<long_double,_std::ratio<1L,_1L>_> *)this_00,(longdouble)0.5);
  std::this_thread::sleep_for<long_double,std::ratio<1l,1l>>(&local_628);
  doWarehouseStuff((IClientConnector *)local_5e8);
  CppHttpLibClientConnector::~CppHttpLibClientConnector((CppHttpLibClientConnector *)local_5e8);
  CppHttpLibServerConnector::~CppHttpLibServerConnector
            ((CppHttpLibServerConnector *)&httpClient.httpClient);
  InMemoryConnector::~InMemoryConnector((InMemoryConnector *)&httpServer.port);
  WarehouseServer::~WarehouseServer((WarehouseServer *)local_d8);
  jsonrpccxx::JsonRpc2Server::~JsonRpc2Server
            ((JsonRpc2Server *)&app.products._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return 0;
}

Assistant:

int main() {
  JsonRpc2Server rpcServer;

  // Bindings
  WarehouseServer app;
  rpcServer.Add("GetProduct", GetHandle(&WarehouseServer::GetProduct, app), {"id"});
  rpcServer.Add("AddProduct", GetHandle(&WarehouseServer::AddProduct, app), {"product"});
  rpcServer.Add("AllProducts", GetHandle(&WarehouseServer::AllProducts, app), {});

  cout << "Running in-memory example" << "\n";
  InMemoryConnector inMemoryConnector(rpcServer);
  doWarehouseStuff(inMemoryConnector);

  cout << "Running http example" << "\n";
  CppHttpLibServerConnector httpServer(rpcServer, 8484);
  cout << "Starting http server: " << std::boolalpha << httpServer.StartListening() << "\n";
  CppHttpLibClientConnector httpClient("localhost", 8484);
  std::this_thread::sleep_for(0.5s);
  doWarehouseStuff(httpClient);

  return 0;
}